

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward.hpp
# Opt level: O3

void __thiscall
backward::SignalHandling::SignalHandling
          (SignalHandling *this,vector<int,_std::allocator<int>_> *posix_signals)

{
  bool bVar1;
  int iVar2;
  char *__tmp;
  _union_1457 _Var3;
  ulong uVar4;
  bool bVar5;
  stack_t ss;
  _union_1457 local_c8;
  sigset_t local_c0;
  undefined4 local_40;
  
  this->_loaded = false;
  _Var3.sa_handler = (__sighandler_t)malloc(0x800000);
  (this->_stack_content)._val = (char *)_Var3;
  (this->_stack_content)._empty = _Var3.sa_handler == (__sighandler_t)0x0;
  if (_Var3.sa_handler == (__sighandler_t)0x0) {
    bVar5 = false;
  }
  else {
    local_c0.__val[1] = 0x800000;
    local_c0.__val[0]._0_4_ = 0;
    local_c8.sa_handler = _Var3.sa_handler;
    iVar2 = sigaltstack((sigaltstack *)&local_c8,(sigaltstack *)0x0);
    bVar5 = -1 < iVar2;
  }
  if ((posix_signals->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
      ._M_finish !=
      (posix_signals->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
      ._M_start) {
    uVar4 = 0;
    do {
      memset(&local_c8,0,0x98);
      local_40 = 0xc8000004;
      sigfillset(&local_c0);
      sigdelset(&local_c0,
                (posix_signals->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                super__Vector_impl_data._M_start[uVar4]);
      local_c8.sa_handler = sig_handler;
      iVar2 = sigaction((posix_signals->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                        super__Vector_impl_data._M_start[uVar4],(sigaction *)&local_c8,
                        (sigaction *)0x0);
      bVar1 = false;
      if (-1 < iVar2) {
        bVar1 = bVar5;
      }
      bVar5 = bVar1;
      uVar4 = uVar4 + 1;
    } while (uVar4 < (ulong)((long)(posix_signals->super__Vector_base<int,_std::allocator<int>_>).
                                   _M_impl.super__Vector_impl_data._M_finish -
                             (long)(posix_signals->super__Vector_base<int,_std::allocator<int>_>).
                                   _M_impl.super__Vector_impl_data._M_start >> 2));
  }
  this->_loaded = bVar5;
  return;
}

Assistant:

SignalHandling(const std::vector<int> &posix_signals = make_default_signals())
      : _loaded(false) {
    bool success = true;

    const size_t stack_size = 1024 * 1024 * 8;
    _stack_content.reset(static_cast<char *>(malloc(stack_size)));
    if (_stack_content) {
      stack_t ss;
      ss.ss_sp = _stack_content.get();
      ss.ss_size = stack_size;
      ss.ss_flags = 0;
      if (sigaltstack(&ss, nullptr) < 0) {
        success = false;
      }
    } else {
      success = false;
    }

    for (size_t i = 0; i < posix_signals.size(); ++i) {
      struct sigaction action;
      memset(&action, 0, sizeof action);
      action.sa_flags =
          static_cast<int>(SA_SIGINFO | SA_ONSTACK | SA_NODEFER | SA_RESETHAND);
      sigfillset(&action.sa_mask);
      sigdelset(&action.sa_mask, posix_signals[i]);
#if defined(__clang__)
#pragma clang diagnostic push
#pragma clang diagnostic ignored "-Wdisabled-macro-expansion"
#endif
      action.sa_sigaction = &sig_handler;
#if defined(__clang__)
#pragma clang diagnostic pop
#endif

      int r = sigaction(posix_signals[i], &action, nullptr);
      if (r < 0)
        success = false;
    }

    _loaded = success;
  }